

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O2

void pnga_step_max(Integer g_a,Integer g_b,void *retval)

{
  long lVar1;
  Integer bndim;
  Integer andim;
  Integer btype;
  Integer atype;
  Integer bhi [7];
  Integer blo [7];
  Integer ahi [7];
  Integer alo [7];
  
  pnga_inquire(g_a,&atype,&andim,ahi);
  pnga_inquire(g_b,&btype,&bndim,bhi);
  while( true ) {
    lVar1 = andim + -1;
    if (lVar1 == -1) break;
    alo[lVar1] = 1;
    blo[bndim + -1] = 1;
    bndim = bndim + -1;
    andim = lVar1;
  }
  pnga_step_max_patch(g_a,alo,ahi,g_b,blo,bhi,retval);
  return;
}

Assistant:

void pnga_step_max(Integer g_a, Integer g_b, void *retval)
{
   Integer atype, andim;
   Integer btype, bndim;
   Integer alo[MAXDIM],ahi[MAXDIM];
   Integer blo[MAXDIM],bhi[MAXDIM];
 
    pnga_inquire(g_a,  &atype, &andim, ahi);
    pnga_inquire(g_b,  &btype, &bndim, bhi);
    while(andim){
        alo[andim-1]=1;
        andim--;
        blo[bndim-1]=1;
        bndim--;
    }
    
#if 0
    pnga_step_max_patch(g_a, alo, ahi, g_b, blo, bhi, retval, OP_STEPMAX);
#else
    pnga_step_max_patch(g_a, alo, ahi, g_b, blo, bhi, retval);
#endif
}